

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

int32_t __thiscall
icu_63::number::impl::DecimalQuantity::getLowerDisplayMagnitude(DecimalQuantity *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->scale;
  iVar2 = this->rOptPos;
  if (this->rOptPos <= iVar1) {
    iVar2 = iVar1;
  }
  if (this->rReqPos < iVar1) {
    iVar2 = this->rReqPos;
  }
  return iVar2;
}

Assistant:

int32_t DecimalQuantity::getLowerDisplayMagnitude() const {
    // If this assertion fails, you need to call roundToInfinity() or some other rounding method.
    // See the comment in the header file explaining the "isApproximate" field.
    U_ASSERT(!isApproximate);

    int32_t magnitude = scale;
    int32_t result = (rReqPos < magnitude) ? rReqPos : (rOptPos > magnitude) ? rOptPos : magnitude;
    return result;
}